

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRuntimeOptions.h
# Opt level: O0

bool loadOptions(App *app,HighsLogOptions *report_log_options,HighsCommandLineOptions *c,
                HighsOptions *options)

{
  HighsLogOptions *pHVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  long in_RCX;
  long lVar7;
  byte *in_RDX;
  HighsLogOptions *in_RSI;
  HighsInt value;
  char *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  HighsLogOptions *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  string local_1d0 [36];
  int local_1ac;
  string local_1a8 [37];
  byte local_183;
  byte local_182;
  undefined1 local_181 [33];
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  long local_28;
  byte *local_20;
  HighsLogOptions *local_18;
  bool local_1;
  
  if ((*in_RDX & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"HiGHS version ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
    poVar4 = std::operator<<(poVar4,".");
    std::ostream::operator<<(poVar4,0);
    poVar4 = std::operator<<((ostream *)&std::cout," Githash ");
    poVar4 = std::operator<<(poVar4,"fd8665394");
    std::operator<<(poVar4,". ");
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&kHighsCopyrightStatement_abi_cxx11_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  pHVar1 = local_18;
  lVar6 = local_28;
  if (bVar2) {
    std::__cxx11::string::string(local_48,(string *)(local_20 + 0x78));
    iVar3 = loadOptionsFromFile(pHVar1,lVar6,local_48);
    std::__cxx11::string::~string(local_48);
    if (iVar3 == -1) {
      return false;
    }
    if (iVar3 == 1) {
      writeOptionsToFile(_stdout,(HighsLogOptions *)(local_28 + 0x380),(vector *)(local_28 + 0x3e0),
                         false,kFull);
      return false;
    }
  }
  bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  pHVar1 = local_18;
  if (bVar2) {
    lVar7 = local_28 + 0x380;
    lVar6 = local_28 + 0x3e0;
    std::__cxx11::string::string(local_78,(string *)(local_20 + 0xb8));
    iVar3 = setLocalOptionValue(pHVar1,&kPresolveString_abi_cxx11_,lVar7,lVar6,local_78);
    std::__cxx11::string::~string(local_78);
    if (iVar3 != 0) {
      return false;
    }
  }
  bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  pHVar1 = local_18;
  if (bVar2) {
    lVar7 = local_28 + 0x380;
    lVar6 = local_28 + 0x3e0;
    std::__cxx11::string::string(local_98,(string *)(local_20 + 0xd8));
    iVar3 = setLocalOptionValue(pHVar1,&kSolverString_abi_cxx11_,lVar7,lVar6,local_98);
    std::__cxx11::string::~string(local_98);
    if (iVar3 != 0) {
      return false;
    }
  }
  bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  pHVar1 = local_18;
  if (bVar2) {
    lVar7 = local_28 + 0x380;
    lVar6 = local_28 + 0x3e0;
    std::__cxx11::string::string(local_b8,(string *)(local_20 + 0xf8));
    iVar3 = setLocalOptionValue(pHVar1,&kParallelString_abi_cxx11_,lVar7,lVar6,local_b8);
    std::__cxx11::string::~string(local_b8);
    if (iVar3 != 0) {
      return false;
    }
  }
  bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  pHVar1 = local_18;
  if (bVar2) {
    lVar7 = local_28 + 0x380;
    lVar6 = local_28 + 0x3e0;
    std::__cxx11::string::string(local_d8,(string *)(local_20 + 0x118));
    iVar3 = setLocalOptionValue(pHVar1,&kRunCrossoverString_abi_cxx11_,lVar7,lVar6,local_d8);
    std::__cxx11::string::~string(local_d8);
    if (iVar3 != 0) {
      return false;
    }
  }
  std::operator+((char *)in_stack_fffffffffffffcd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcd0);
  sVar5 = CLI::App::count((App *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                          in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_f8);
  if ((sVar5 == 0) ||
     (iVar3 = setLocalOptionValue(local_18,(string *)&kTimeLimitString_abi_cxx11_,
                                  (vector *)(local_28 + 0x3e0),*(double *)(local_20 + 8)),
     iVar3 == 0)) {
    bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    pHVar1 = local_18;
    if (bVar2) {
      lVar7 = local_28 + 0x380;
      lVar6 = local_28 + 0x3e0;
      std::__cxx11::string::string(local_118,(string *)(local_20 + 0x138));
      local_13a = 0;
      local_13b = 0;
      iVar3 = setLocalOptionValue(pHVar1,&kSolutionFileString_abi_cxx11_,lVar7,lVar6,local_118);
      pHVar1 = local_18;
      bVar2 = true;
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        local_13a = 1;
        std::__cxx11::string::string(local_138,"write_solution_to_file",&local_139);
        local_13b = 1;
        iVar3 = setLocalOptionValue(pHVar1,local_138,(vector *)(local_28 + 0x3e0),true);
        bVar2 = iVar3 != 0;
      }
      if ((local_13b & 1) != 0) {
        std::__cxx11::string::~string(local_138);
      }
      if ((local_13a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      std::__cxx11::string::~string(local_118);
      if (bVar2) {
        return false;
      }
    }
    bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    pHVar1 = local_18;
    if (bVar2) {
      lVar7 = local_28 + 0x380;
      lVar6 = local_28 + 0x3e0;
      std::__cxx11::string::string(local_160,(string *)(local_20 + 0x158));
      local_182 = 0;
      local_183 = 0;
      iVar3 = setLocalOptionValue(pHVar1,&kWriteModelFileString_abi_cxx11_,lVar7,lVar6,local_160);
      bVar2 = true;
      if (iVar3 == 0) {
        in_stack_fffffffffffffcd8 = (string *)local_181;
        in_stack_fffffffffffffcd0 = local_18;
        std::allocator<char>::allocator();
        local_182 = 1;
        std::__cxx11::string::string
                  ((string *)(local_181 + 1),"write_model_to_file",
                   (allocator *)in_stack_fffffffffffffcd8);
        local_183 = 1;
        iVar3 = setLocalOptionValue(in_stack_fffffffffffffcd0,(string *)(local_181 + 1),
                                    (vector *)(local_28 + 0x3e0),true);
        bVar2 = iVar3 != 0;
      }
      in_stack_fffffffffffffce7 = bVar2;
      if ((local_183 & 1) != 0) {
        std::__cxx11::string::~string((string *)(local_181 + 1));
      }
      if ((local_182 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)local_181);
      }
      std::__cxx11::string::~string(local_160);
      if (bVar2 != false) {
        return false;
      }
    }
    std::operator+((char *)in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcd0);
    sVar5 = CLI::App::count((App *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                            in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string(local_1a8);
    if (sVar5 != 0) {
      local_1ac = *(int *)(local_20 + 0x10);
      iVar3 = setLocalOptionValue(local_18,(string *)&kRandomSeedString_abi_cxx11_,
                                  (vector *)(local_28 + 0x3e0),local_1ac);
      if (iVar3 != 0) {
        return false;
      }
    }
    bVar2 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (bVar2) {
      lVar6 = local_28 + 0x380;
      std::__cxx11::string::string(local_1d0,(string *)(local_20 + 0x178));
      iVar3 = setLocalOptionValue(local_18,&kRangingString_abi_cxx11_,lVar6,local_28 + 0x3e0,
                                  local_1d0);
      std::__cxx11::string::~string(local_1d0);
      if (iVar3 != 0) {
        return false;
      }
    }
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 0) {
      std::operator<<((ostream *)&std::cout,"Please specify filename in .mps|.lp|.ems format.\n");
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool loadOptions(const CLI::App& app, const HighsLogOptions& report_log_options,
                 const HighsCommandLineOptions& c, HighsOptions& options) {
  if (c.cmd_version) {
    std::cout << "HiGHS version " << HIGHS_VERSION_MAJOR << "."
              << HIGHS_VERSION_MINOR << "." << HIGHS_VERSION_PATCH;
    std::cout << " Githash " << HIGHS_GITHASH << ". ";
    std::cout << kHighsCopyrightStatement << std::endl;
    exit(0);
  }

  // Options file.
  if (c.options_file != "") {
    switch (loadOptionsFromFile(report_log_options, options, c.options_file)) {
      case HighsLoadOptionsStatus::kError:
        return false;
      case HighsLoadOptionsStatus::kEmpty:
        writeOptionsToFile(stdout, options.log_options, options.records);
        return false;
      default:
        break;
    }
  }
  // Handle command line option specifications.
  // Presolve option.
  if (c.cmd_presolve != "") {
    if (setLocalOptionValue(report_log_options, kPresolveString,
                            options.log_options, options.records,
                            c.cmd_presolve) != OptionStatus::kOk)
      return false;
  }

  // Solver option.
  if (c.cmd_solver != "") {
    if (setLocalOptionValue(report_log_options, kSolverString,
                            options.log_options, options.records,
                            c.cmd_solver) != OptionStatus::kOk)
      return false;
  }

  // Parallel option.
  if (c.cmd_parallel != "") {
    if (setLocalOptionValue(report_log_options, kParallelString,
                            options.log_options, options.records,
                            c.cmd_parallel) != OptionStatus::kOk)
      return false;
  }

  // Run crossover option.
  if (c.cmd_crossover != "") {
    if (setLocalOptionValue(report_log_options, kRunCrossoverString,
                            options.log_options, options.records,
                            c.cmd_crossover) != OptionStatus::kOk)
      return false;
  }

  // Time limit option.
  if (app.count("--" + kTimeLimitString) > 0) {
    if (setLocalOptionValue(report_log_options, kTimeLimitString,
                            options.records,
                            c.cmd_time_limit) != OptionStatus::kOk)
      return false;
  }

  // Solution file option.
  if (c.cmd_solution_file != "") {
    if (setLocalOptionValue(report_log_options, kSolutionFileString,
                            options.log_options, options.records,
                            c.cmd_solution_file) != OptionStatus::kOk ||
        setLocalOptionValue(report_log_options, "write_solution_to_file",
                            options.records, true) != OptionStatus::kOk)
      return false;
  }

  // Write model file option.
  if (c.cmd_write_model_file != "") {
    // std::cout << "Multiple write model files not implemented.\n";
    if (setLocalOptionValue(report_log_options, kWriteModelFileString,
                            options.log_options, options.records,
                            c.cmd_write_model_file) != OptionStatus::kOk ||
        setLocalOptionValue(report_log_options, "write_model_to_file",
                            options.records, true) != OptionStatus::kOk)
      return false;
  }

  // Random seed option.
  if (app.count("--" + kRandomSeedString) > 0) {
    HighsInt value = c.cmd_random_seed;
    if (setLocalOptionValue(report_log_options, kRandomSeedString,
                            options.records, value) != OptionStatus::kOk)
      return false;
  }

  // Ranging option.
  if (c.cmd_ranging != "") {
    if (setLocalOptionValue(report_log_options, kRangingString,
                            options.log_options, options.records,
                            c.cmd_ranging) != OptionStatus::kOk)
      return false;
  }

  // If this horrible hack is still needed, please add it to RunHighs.
  // model_file is now const in this method.

  // const bool horrible_hack_for_windows_visual_studio = false;
  // if (horrible_hack_for_windows_visual_studio) {
  //   // Until I know how to debug an executable using command line
  //   // arguments in Visual Studio on Windows, this is necessary!
  //   HighsInt random_seed = -3;
  //   if (random_seed >= 0) {
  //     if (setLocalOptionValue(report_log_options, kRandomSeedString,
  //                             options.records,
  //                             random_seed) != OptionStatus::kOk)
  //       return false;
  //   }
  //   model_file = "ml.mps";
  // }

  if (c.model_file.size() == 0) {
    std::cout << "Please specify filename in .mps|.lp|.ems format.\n";
    return false;
  }

  return true;
}